

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall DnsStats::LoadRegisteredTLD_from_memory(DnsStats *this)

{
  uint8_t *tld;
  TldAsKey *this_00;
  size_t tld_len;
  TldAsKey *tak;
  ulong uStack_18;
  bool stored;
  size_t i;
  DnsStats *this_local;
  
  i = (size_t)this;
  for (uStack_18 = 0; uStack_18 < 0x5a3; uStack_18 = uStack_18 + 1) {
    tak._7_1_ = 0;
    this_00 = (TldAsKey *)operator_new(0x70);
    tld = (uint8_t *)RegisteredTldName[uStack_18];
    tld_len = strlen((char *)tld);
    TldAsKey::TldAsKey(this_00,tld,tld_len);
    BinHash<TldAsKey>::InsertOrAdd(&this->registeredTld,this_00,false,(bool *)((long)&tak + 7));
    if (((tak._7_1_ & 1) == 0) && (this_00 != (TldAsKey *)0x0)) {
      TldAsKey::~TldAsKey(this_00);
      operator_delete(this_00);
    }
  }
  return;
}

Assistant:

void DnsStats::LoadRegisteredTLD_from_memory()
{
    for (size_t i = 0; i < RegisteredTldNameNb; i++)
    {
        bool stored = false;
        TldAsKey * tak = new
            TldAsKey((uint8_t *) RegisteredTldName[i], strlen(RegisteredTldName[i]));

        registeredTld.InsertOrAdd(tak, false, &stored);

        if (!stored)
        {
            delete tak;
        }
    }
}